

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseFunctionParam(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ParseState copy;
  
  iVar8 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar8 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar8) {
    bVar7 = false;
    goto LAB_00380783;
  }
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar6 = ParseTwoCharToken(state,"fp");
  if (bVar6) {
    ParseCVQualifiers(state);
    ParseNumber(state,(int *)0x0);
    bVar6 = ParseOneCharToken(state,'_');
    bVar7 = true;
    if (!bVar6) goto LAB_00380706;
  }
  else {
LAB_00380706:
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"fL");
    if (bVar6) {
      ParseNumber(state,(int *)0x0);
      bVar6 = ParseOneCharToken(state,'p');
      if (bVar6) {
        ParseCVQualifiers(state);
        ParseNumber(state,(int *)0x0);
        bVar6 = ParseOneCharToken(state,'_');
        bVar7 = true;
        if (bVar6) goto LAB_0038077e;
      }
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar7 = ParseThreeCharToken(state,"fpT");
  }
LAB_0038077e:
  iVar8 = state->recursion_depth + -1;
LAB_00380783:
  state->recursion_depth = iVar8;
  return bVar7;
}

Assistant:

static bool ParseFunctionParam(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;

  // Function-param expression (level 0).
  if (ParseTwoCharToken(state, "fp") && Optional(ParseCVQualifiers(state)) &&
      Optional(ParseNumber(state, nullptr)) && ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  // Function-param expression (level 1+).
  if (ParseTwoCharToken(state, "fL") && Optional(ParseNumber(state, nullptr)) &&
      ParseOneCharToken(state, 'p') && Optional(ParseCVQualifiers(state)) &&
      Optional(ParseNumber(state, nullptr)) && ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  return ParseThreeCharToken(state, "fpT");
}